

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O2

void __thiscall xray_re::xr_ogf_v4::load_s_lods(xr_ogf_v4 *this,xr_reader *r)

{
  byte *pbVar1;
  xr_ogf *pxVar2;
  size_t sVar3;
  xr_ogf_v4 *this_00;
  uint32_t id;
  xr_ogf *ogf;
  xr_reader *s;
  xr_ogf_v4 *local_48;
  xr_reader *local_40;
  xr_ogf_v4 *local_38;
  
  sVar3 = xr_reader::size(r);
  if (sVar3 < 0x101) {
    xr_reader::r_sz(r,&(this->super_xr_ogf).super_xr_object.m_lod_ref);
  }
  else {
    if ((this->super_xr_ogf).m_lods.
        super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->super_xr_ogf).m_lods.
        super__Vector_base<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("m_lods.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                    ,0x117,"void xray_re::xr_ogf_v4::load_s_lods(xr_reader &)");
    }
    pxVar2 = &this->super_xr_ogf;
    id = 0;
    local_38 = this;
    while (local_40 = xr_reader::open_chunk(r,id), this = local_38, local_40 != (xr_reader *)0x0) {
      this_00 = (xr_ogf_v4 *)operator_new(0x7b8);
      xr_ogf_v4(this_00);
      local_48 = this_00;
      std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::push_back
                (&pxVar2->m_lods,(value_type *)&local_48);
      (*(local_48->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
        [0x15])(local_48,local_40);
      xr_reader::close_chunk(r,&local_40);
      id = id + 1;
    }
  }
  pbVar1 = (byte *)((long)&(this->super_xr_ogf).m_loaded + 2);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

void xr_ogf_v4::load_s_lods(xr_reader& r)
{
	// 2945 uses embedded LOD model while 3120, 3456+ reference external file.
	// try to distinguish by size.
	if (r.size() <= 0x100) {
		r.r_sz(m_lod_ref);
	} else {
		assert(m_lods.empty());
		xr_reader* s;
		for (uint32_t id = 0; (s = r.open_chunk(id)); ++id) {
			xr_ogf* ogf = new xr_ogf_v4;
			m_lods.push_back(ogf);
			ogf->load_ogf(*s);
			r.close_chunk(s);
		}
	}
	set_chunk_loaded(OGF4_S_LODS);
}